

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiListClipper::Begin(ImGuiListClipper *this,int count,float items_height)

{
  float fVar1;
  float items_height_local;
  int count_local;
  ImGuiListClipper *this_local;
  
  fVar1 = ImGui::GetCursorPosY();
  this->StartPosY = fVar1;
  this->ItemsHeight = items_height;
  this->ItemsCount = count;
  this->StepNo = 0;
  this->DisplayStart = -1;
  this->DisplayEnd = -1;
  if (0.0 < this->ItemsHeight) {
    ImGui::CalcListClipping
              (this->ItemsCount,this->ItemsHeight,&this->DisplayStart,&this->DisplayEnd);
    if (0 < this->DisplayStart) {
      SetCursorPosYAndSetupDummyPrevLine
                ((float)this->DisplayStart * this->ItemsHeight + this->StartPosY,this->ItemsHeight);
    }
    this->StepNo = 2;
  }
  return;
}

Assistant:

void ImGuiListClipper::Begin(int count, float items_height)
{
    StartPosY = ImGui::GetCursorPosY();
    ItemsHeight = items_height;
    ItemsCount = count;
    StepNo = 0;
    DisplayEnd = DisplayStart = -1;
    if (ItemsHeight > 0.0f)
    {
        ImGui::CalcListClipping(ItemsCount, ItemsHeight, &DisplayStart, &DisplayEnd); // calculate how many to clip/display
        if (DisplayStart > 0)
            SetCursorPosYAndSetupDummyPrevLine(StartPosY + DisplayStart * ItemsHeight, ItemsHeight); // advance cursor
        StepNo = 2;
    }
}